

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O0

void Ppmd8_Construct(CPpmd8 *p)

{
  uint uVar1;
  int local_24;
  int local_20;
  uint local_1c;
  uint step;
  uint m;
  uint k;
  uint i;
  CPpmd8 *p_local;
  
  p->Base = (Byte *)0x0;
  step = 0;
  for (m = 0; m < 0x26; m = m + 1) {
    if (m < 0xc) {
      local_24 = (m >> 2) + 1;
    }
    else {
      local_24 = 4;
    }
    local_20 = local_24;
    do {
      uVar1 = step + 1;
      p->Units2Indx[step] = (Byte)m;
      local_20 = local_20 + -1;
      step = uVar1;
    } while (local_20 != 0);
    p->Indx2Units[m] = (Byte)uVar1;
  }
  p->NS2BSIndx[0] = '\0';
  p->NS2BSIndx[1] = '\x02';
  memset(p->NS2BSIndx + 2,4,9);
  memset(p->NS2BSIndx + 0xb,6,0xf5);
  for (m = 0; m < 5; m = m + 1) {
    p->NS2Indx[m] = (Byte)m;
  }
  local_1c = m;
  step = 1;
  for (; m < 0x104; m = m + 1) {
    p->NS2Indx[m] = (Byte)local_1c;
    step = step - 1;
    if (step == 0) {
      step = local_1c - 3;
      local_1c = local_1c + 1;
    }
  }
  return;
}

Assistant:

void Ppmd8_Construct(CPpmd8 *p)
{
  unsigned i, k, m;

  p->Base = 0;

  for (i = 0, k = 0; i < PPMD_NUM_INDEXES; i++)
  {
    unsigned step = (i >= 12 ? 4 : (i >> 2) + 1);
    do { p->Units2Indx[k++] = (Byte)i; } while (--step);
    p->Indx2Units[i] = (Byte)k;
  }

  p->NS2BSIndx[0] = (0 << 1);
  p->NS2BSIndx[1] = (1 << 1);
  memset(p->NS2BSIndx + 2, (2 << 1), 9);
  memset(p->NS2BSIndx + 11, (3 << 1), 256 - 11);

  for (i = 0; i < 5; i++)
    p->NS2Indx[i] = (Byte)i;
  for (m = i, k = 1; i < 260; i++)
  {
    p->NS2Indx[i] = (Byte)m;
    if (--k == 0)
      k = (++m) - 4;
  }
}